

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.cpp
# Opt level: O2

void __thiscall MppThread::stop(MppThread *this)

{
  void *dummy;
  void *pvStack_18;
  
  if (this->mStatus[0] != MPP_THREAD_UNINITED) {
    pthread_mutex_lock((pthread_mutex_t *)this->mMutexCond);
    this->mStatus[0] = MPP_THREAD_STOPPING;
    pthread_cond_signal((pthread_cond_t *)&this->mMutexCond[0].mCondition);
    pthread_mutex_unlock((pthread_mutex_t *)this->mMutexCond);
    pthread_join(this->mThread,&pvStack_18);
    this->mStatus[0] = MPP_THREAD_UNINITED;
  }
  return;
}

Assistant:

void MppThread::stop()
{
    if (MPP_THREAD_UNINITED != get_status()) {
        lock();
        set_status(MPP_THREAD_STOPPING);
        thread_dbg(MPP_THREAD_DBG_FUNCTION,
                   "MPP_THREAD_STOPPING status set mThread %p", this);
        signal();
        unlock();
        void *dummy;
        pthread_join(mThread, &dummy);
        thread_dbg(MPP_THREAD_DBG_FUNCTION,
                   "thread %s %p context %p destroy success\n",
                   mName, mFunction, mContext);

        set_status(MPP_THREAD_UNINITED);
    }
}